

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer.cpp
# Opt level: O2

void __thiscall CMU462::PathTracer::update_screen(PathTracer *this)

{
  State SVar1;
  
  SVar1 = this->state;
  if ((SVar1 != DONE) && (SVar1 != RENDERING)) {
    if (SVar1 == VISUALIZE) {
      visualize_accel(this);
      return;
    }
    return;
  }
  glDrawPixels((int)(this->frameBuffer).w,(int)(this->frameBuffer).h,0x1908,0x1401,
               (this->frameBuffer).data.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start);
  return;
}

Assistant:

void PathTracer::update_screen() {
    switch (state) {
      case INIT:
      case READY:
        break;
      case VISUALIZE:
        visualize_accel();
        break;
      case RENDERING:
        glDrawPixels(frameBuffer.w, frameBuffer.h, GL_RGBA,
            GL_UNSIGNED_BYTE, &frameBuffer.data[0]);
        break;
      case DONE:
        //sampleBuffer.tonemap(frameBuffer, tm_gamma, tm_level, tm_key, tm_wht);
        glDrawPixels(frameBuffer.w, frameBuffer.h, GL_RGBA,
            GL_UNSIGNED_BYTE, &frameBuffer.data[0]);
        break;
    }
  }